

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bit-map-type.cpp
# Opt level: O1

Up __thiscall yactfr::FixedLengthBitMapType::_clone(FixedLengthBitMapType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_40;
  undefined1 local_38 [24];
  MapItem *local_20;
  
  local_38._20_4_ = *(undefined4 *)(in_RSI + 0xc);
  local_38._16_4_ = *(undefined4 *)(in_RSI + 0x18);
  local_38._12_4_ = *(uint *)(in_RSI + 0x1c);
  local_38._8_4_ = *(_tKind *)(in_RSI + 0x20);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    local_40._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffffe0,*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8
                  );
    local_40._M_head_impl = local_20;
    local_20 = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffffe0);
  }
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((FixedLengthBitMapType *)local_38,(uint *)(local_38 + 0x14),(uint *)(local_38 + 0x10),
             (ByteOrder *)(local_38 + 0xc),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)(in_RSI + 0x28),(BitOrder *)(local_38 + 8),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_40);
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)local_38._0_8_;
  local_38._0_8_ = (_func_int **)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_40);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBitMapType::_clone() const
{
    return FixedLengthBitMapType::create(this->alignment(), this->length(), this->byteOrder(),
                                         _flags, this->bitOrder(),
                                         internal::tryCloneAttrs(this->attributes()));
}